

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd_int8.h
# Opt level: O3

void ncnn::transpose_pack_B_tile_int8(Mat *B,Mat *BT,int batch,int max_jj,int max_kk,int nT)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  undefined1 (*pauVar27) [32];
  long lVar28;
  undefined1 (*pauVar29) [32];
  undefined1 (*pauVar30) [16];
  undefined2 *puVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  long local_68;
  
  if (0 < batch) {
    iVar21 = max_jj * batch;
    lVar23 = (long)(iVar21 * 2);
    lVar24 = (long)iVar21;
    uVar17 = max_kk & 0xfffffff8;
    lVar20 = (long)max_jj;
    lVar11 = (long)(iVar21 * 8) * 2;
    local_68 = 0;
    uVar19 = 0;
    uVar22 = 0;
    do {
      pauVar27 = (undefined1 (*) [32])((long)BT->w * uVar22 * BT->elemsize + (long)BT->data);
      if (max_jj < 8) {
        uVar15 = 0;
      }
      else {
        lVar14 = (ulong)uVar19 * -2;
        lVar28 = (ulong)uVar19 << 2;
        uVar12 = 0;
        uVar18 = uVar19;
        do {
          lVar13 = uVar12 + (uint)((int)uVar22 * max_jj);
          uVar15 = (ulong)(uint)((int)lVar13 * 8);
          if (max_kk < 8) {
            pauVar29 = (undefined1 (*) [32])((long)B->data + uVar15 * 2);
            uVar16 = 0;
          }
          else {
            pauVar29 = (undefined1 (*) [32])((long)B->data + (ulong)(uVar18 & 0x1fffffff) * 0x10);
            iVar21 = 7;
            do {
              auVar32._16_16_ = *(undefined1 (*) [16])pauVar29[2];
              auVar32._0_16_ = SUB3216(*pauVar29,0);
              auVar9 = vperm2f128_avx(*pauVar29,pauVar29[2],0x31);
              auVar33._16_16_ = *(undefined1 (*) [16])pauVar29[3];
              auVar33._0_16_ = SUB3216(pauVar29[1],0);
              auVar10 = vperm2f128_avx(pauVar29[1],pauVar29[3],0x31);
              auVar7 = vunpcklps_avx(auVar32,auVar9);
              auVar9 = vunpckhps_avx(auVar32,auVar9);
              auVar8 = vunpcklps_avx(auVar33,auVar10);
              auVar10 = vunpckhps_avx(auVar33,auVar10);
              auVar32 = vunpcklpd_avx(auVar7,auVar8);
              auVar7 = vunpckhpd_avx(auVar7,auVar8);
              auVar8 = vunpcklpd_avx(auVar9,auVar10);
              auVar9 = vunpckhpd_avx(auVar9,auVar10);
              *pauVar27 = auVar32;
              pauVar27[1] = auVar7;
              pauVar27[2] = auVar8;
              pauVar27[3] = auVar9;
              pauVar27 = pauVar27 + 4;
              pauVar29 = (undefined1 (*) [32])(*pauVar29 + lVar11);
              iVar21 = iVar21 + 8;
              uVar16 = uVar17;
            } while (iVar21 < max_kk);
          }
          if ((int)(uVar16 | 1) < max_kk) {
            pauVar29 = (undefined1 (*) [32])
                       ((long)pauVar29 + lVar28 + (ulong)(uVar18 & 0x1fffffff) * -0x10);
            uVar25 = uVar16;
            do {
              *pauVar27 = *pauVar29;
              pauVar27 = pauVar27 + 1;
              uVar16 = uVar25 + 2;
              pauVar29 = (undefined1 (*) [32])(*pauVar29 + lVar23 * 2);
              iVar21 = uVar25 + 3;
              uVar25 = uVar16;
            } while (iVar21 < max_kk);
          }
          else {
            pauVar29 = (undefined1 (*) [32])((long)pauVar29 + lVar13 * 4 + uVar15 * -2);
          }
          iVar21 = max_kk - uVar16;
          if (iVar21 != 0 && (int)uVar16 <= max_kk) {
            pauVar30 = (undefined1 (*) [16])(*pauVar29 + lVar14);
            do {
              *(undefined1 (*) [16])*pauVar27 = *pauVar30;
              pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
              pauVar30 = (undefined1 (*) [16])(*pauVar30 + lVar24 * 2);
              iVar21 = iVar21 + -1;
            } while (iVar21 != 0);
          }
          uVar15 = uVar12 + 8;
          lVar13 = uVar12 + 0xf;
          uVar18 = uVar18 + 8;
          lVar28 = lVar28 + 0x20;
          lVar14 = lVar14 + -0x10;
          uVar12 = uVar15;
        } while (lVar13 < lVar20);
      }
      if ((int)((uint)uVar15 | 3) < max_jj) {
        lVar14 = local_68 + (uVar15 & 0xffffffff);
        lVar28 = lVar14 * 0x10;
        lVar13 = lVar14 * -0xc;
        lVar14 = lVar14 * -2 + 6;
        uVar12 = uVar15 & 0xffffffff;
        do {
          lVar26 = uVar12 + uVar22 * lVar20;
          if (max_kk < 8) {
            pauVar30 = (undefined1 (*) [16])((long)B->data + lVar26 * 0x10);
            uVar18 = 0;
          }
          else {
            pauVar30 = (undefined1 (*) [16])((long)B->data + lVar28);
            iVar21 = 7;
            do {
              auVar5 = vunpcklps_avx(*pauVar30,pauVar30[1]);
              auVar3 = vunpckhps_avx(*pauVar30,pauVar30[1]);
              auVar6 = vunpcklps_avx(pauVar30[2],pauVar30[3]);
              auVar4 = vunpckhps_avx(pauVar30[2],pauVar30[3]);
              auVar2 = vmovlhps_avx(auVar5,auVar6);
              auVar6 = vunpckhpd_avx(auVar5,auVar6);
              auVar5 = vmovlhps_avx(auVar3,auVar4);
              auVar3 = vunpckhpd_avx(auVar3,auVar4);
              *(undefined1 (*) [16])*pauVar27 = auVar2;
              *(undefined1 (*) [16])(*pauVar27 + 0x10) = auVar6;
              *(undefined1 (*) [16])pauVar27[1] = auVar5;
              *(undefined1 (*) [16])(pauVar27[1] + 0x10) = auVar3;
              pauVar27 = pauVar27 + 2;
              pauVar30 = (undefined1 (*) [16])(*pauVar30 + lVar11);
              iVar21 = iVar21 + 8;
              uVar18 = uVar17;
            } while (iVar21 < max_kk);
          }
          if ((int)(uVar18 | 1) < max_kk) {
            pauVar30 = (undefined1 (*) [16])(*pauVar30 + lVar13);
            uVar16 = uVar18;
            do {
              *(undefined1 (*) [16])*pauVar27 = *pauVar30;
              pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
              uVar18 = uVar16 + 2;
              pauVar30 = (undefined1 (*) [16])(*pauVar30 + lVar23 * 2);
              iVar21 = uVar16 + 3;
              uVar16 = uVar18;
            } while (iVar21 < max_kk);
          }
          else {
            pauVar30 = (undefined1 (*) [16])((long)pauVar30 + lVar26 * -0xc);
          }
          iVar21 = max_kk - uVar18;
          if (iVar21 != 0 && (int)uVar18 <= max_kk) {
            puVar31 = (undefined2 *)(*pauVar30 + lVar14);
            do {
              *(undefined2 *)*pauVar27 = puVar31[-3];
              *(undefined2 *)(*pauVar27 + 2) = puVar31[-2];
              *(undefined2 *)(*pauVar27 + 4) = puVar31[-1];
              *(undefined2 *)(*pauVar27 + 6) = *puVar31;
              pauVar27 = (undefined1 (*) [32])(*pauVar27 + 8);
              puVar31 = puVar31 + lVar24;
              iVar21 = iVar21 + -1;
            } while (iVar21 != 0);
          }
          uVar15 = uVar12 + 4;
          lVar26 = uVar12 + 7;
          lVar28 = lVar28 + 0x40;
          lVar13 = lVar13 + -0x30;
          lVar14 = lVar14 + -8;
          uVar12 = uVar15;
        } while (lVar26 < lVar20);
      }
      if ((int)((uint)uVar15 | 1) < max_jj) {
        lVar14 = local_68 + (uVar15 & 0xffffffff);
        lVar28 = lVar14 * 0x10;
        lVar13 = lVar14 * -0xc;
        lVar14 = lVar14 * -2 + 2;
        uVar12 = uVar15 & 0xffffffff;
        do {
          lVar26 = uVar12 + uVar22 * lVar20;
          if (max_kk < 8) {
            pauVar30 = (undefined1 (*) [16])((long)B->data + lVar26 * 0x10);
            uVar18 = 0;
          }
          else {
            pauVar30 = (undefined1 (*) [16])((long)B->data + lVar28);
            iVar21 = 7;
            do {
              auVar5 = vunpcklps_avx(*pauVar30,pauVar30[1]);
              auVar2 = vunpckhps_avx(*pauVar30,pauVar30[1]);
              *(undefined1 (*) [16])*pauVar27 = auVar5;
              *(undefined1 (*) [16])(*pauVar27 + 0x10) = auVar2;
              pauVar27 = pauVar27 + 1;
              iVar21 = iVar21 + 8;
              pauVar30 = (undefined1 (*) [16])(*pauVar30 + lVar11);
              uVar18 = uVar17;
            } while (iVar21 < max_kk);
          }
          if ((int)(uVar18 | 1) < max_kk) {
            puVar31 = (undefined2 *)(*pauVar30 + lVar13);
            uVar16 = uVar18;
            do {
              *(undefined2 *)*pauVar27 = *puVar31;
              *(undefined2 *)(*pauVar27 + 2) = puVar31[1];
              *(undefined2 *)(*pauVar27 + 4) = puVar31[2];
              *(undefined2 *)(*pauVar27 + 6) = puVar31[3];
              pauVar27 = (undefined1 (*) [32])(*pauVar27 + 8);
              uVar18 = uVar16 + 2;
              iVar21 = uVar16 + 3;
              puVar31 = puVar31 + lVar23;
              uVar16 = uVar18;
            } while (iVar21 < max_kk);
          }
          else {
            puVar31 = (undefined2 *)((long)pauVar30 + lVar26 * -0xc);
          }
          iVar21 = max_kk - uVar18;
          if (iVar21 != 0 && (int)uVar18 <= max_kk) {
            puVar31 = (undefined2 *)((long)puVar31 + lVar14);
            do {
              *(undefined2 *)*pauVar27 = puVar31[-1];
              *(undefined2 *)(*pauVar27 + 2) = *puVar31;
              pauVar27 = (undefined1 (*) [32])(*pauVar27 + 4);
              puVar31 = puVar31 + lVar24;
              iVar21 = iVar21 + -1;
            } while (iVar21 != 0);
          }
          uVar15 = uVar12 + 2;
          lVar26 = uVar12 + 3;
          lVar28 = lVar28 + 0x20;
          lVar13 = lVar13 + -0x18;
          lVar14 = lVar14 + -4;
          uVar12 = uVar15;
        } while (lVar26 < lVar20);
      }
      if ((int)uVar15 < max_jj) {
        lVar14 = (long)(int)uVar15;
        lVar13 = local_68 + lVar14;
        lVar26 = lVar13 * 0x10;
        lVar28 = lVar13 * -0xc;
        lVar13 = lVar13 * -2;
        do {
          lVar1 = lVar14 + uVar22 * lVar20;
          if (max_kk < 8) {
            pauVar30 = (undefined1 (*) [16])((long)B->data + lVar1 * 0x10);
            uVar18 = 0;
          }
          else {
            pauVar30 = (undefined1 (*) [16])((long)B->data + lVar26);
            iVar21 = 7;
            do {
              *(undefined1 (*) [16])*pauVar27 = *pauVar30;
              pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
              iVar21 = iVar21 + 8;
              pauVar30 = (undefined1 (*) [16])(*pauVar30 + lVar11);
              uVar18 = uVar17;
            } while (iVar21 < max_kk);
          }
          if ((int)(uVar18 | 1) < max_kk) {
            puVar31 = (undefined2 *)(*pauVar30 + lVar28);
            uVar16 = uVar18;
            do {
              *(undefined2 *)*pauVar27 = *puVar31;
              *(undefined2 *)(*pauVar27 + 2) = puVar31[1];
              pauVar27 = (undefined1 (*) [32])(*pauVar27 + 4);
              uVar18 = uVar16 + 2;
              iVar21 = uVar16 + 3;
              puVar31 = puVar31 + lVar23;
              uVar16 = uVar18;
            } while (iVar21 < max_kk);
          }
          else {
            puVar31 = (undefined2 *)((long)pauVar30 + lVar1 * -0xc);
          }
          iVar21 = max_kk - uVar18;
          if (iVar21 != 0 && (int)uVar18 <= max_kk) {
            puVar31 = (undefined2 *)((long)puVar31 + lVar13);
            do {
              *(undefined2 *)*pauVar27 = *puVar31;
              pauVar27 = (undefined1 (*) [32])(*pauVar27 + 2);
              puVar31 = puVar31 + lVar24;
              iVar21 = iVar21 + -1;
            } while (iVar21 != 0);
          }
          lVar14 = lVar14 + 1;
          lVar26 = lVar26 + 0x10;
          lVar28 = lVar28 + -0xc;
          lVar13 = lVar13 + -2;
        } while (lVar14 != lVar20);
      }
      uVar22 = uVar22 + 1;
      uVar19 = uVar19 + max_jj;
      local_68 = local_68 + lVar20;
    } while (uVar22 != (uint)batch);
  }
  return;
}

Assistant:

static void transpose_pack_B_tile_int8(const Mat& B, Mat& BT, int batch, int max_jj, int max_kk, int nT)
{
    #pragma omp parallel for num_threads(nT)
    for (int b = 0; b < batch; b++)
    {
        short* pp = BT.row<short>(b);

        int jj = 0;
#if __SSE2__
#if defined(__x86_64__) || defined(_M_X64)
#if __AVX512F__
        for (; jj + 15 < max_jj; jj += 16)
        {
            const short* p0 = B;

            int kk = 0;
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512i _r0 = _mm512_loadu_si512((const __m512i*)p0);
                __m512i _r1 = _mm512_loadu_si512((const __m512i*)(p0 + 32));
                __m512i _r2 = _mm512_loadu_si512((const __m512i*)(p0 + 64));
                __m512i _r3 = _mm512_loadu_si512((const __m512i*)(p0 + 96));
                __m512i _r4 = _mm512_loadu_si512((const __m512i*)(p0 + 128));
                __m512i _r5 = _mm512_loadu_si512((const __m512i*)(p0 + 160));
                __m512i _r6 = _mm512_loadu_si512((const __m512i*)(p0 + 192));
                __m512i _r7 = _mm512_loadu_si512((const __m512i*)(p0 + 224));
                __m512i _tmp0 = _mm512_shuffle_i32x4(_r0, _r2, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp1 = _mm512_shuffle_i32x4(_r0, _r2, _MM_SHUFFLE(3, 2, 3, 2));
                __m512i _tmp2 = _mm512_shuffle_i32x4(_r1, _r3, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp3 = _mm512_shuffle_i32x4(_r1, _r3, _MM_SHUFFLE(3, 2, 3, 2));
                __m512i _tmp4 = _mm512_shuffle_i32x4(_r4, _r6, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp5 = _mm512_shuffle_i32x4(_r4, _r6, _MM_SHUFFLE(3, 2, 3, 2));
                __m512i _tmp6 = _mm512_shuffle_i32x4(_r5, _r7, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp7 = _mm512_shuffle_i32x4(_r5, _r7, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm512_unpacklo_epi32(_tmp0, _tmp1);
                _r1 = _mm512_unpackhi_epi32(_tmp0, _tmp1);
                _r2 = _mm512_unpacklo_epi32(_tmp2, _tmp3);
                _r3 = _mm512_unpackhi_epi32(_tmp2, _tmp3);
                _r4 = _mm512_unpacklo_epi32(_tmp4, _tmp5);
                _r5 = _mm512_unpackhi_epi32(_tmp4, _tmp5);
                _r6 = _mm512_unpacklo_epi32(_tmp6, _tmp7);
                _r7 = _mm512_unpackhi_epi32(_tmp6, _tmp7);
                _tmp0 = _mm512_unpacklo_epi64(_r0, _r2);
                _tmp1 = _mm512_unpackhi_epi64(_r0, _r2);
                _tmp2 = _mm512_unpacklo_epi64(_r1, _r3);
                _tmp3 = _mm512_unpackhi_epi64(_r1, _r3);
                _tmp4 = _mm512_unpacklo_epi64(_r4, _r6);
                _tmp5 = _mm512_unpackhi_epi64(_r4, _r6);
                _tmp6 = _mm512_unpacklo_epi64(_r5, _r7);
                _tmp7 = _mm512_unpackhi_epi64(_r5, _r7);
                _r0 = _mm512_shuffle_i32x4(_tmp0, _tmp4, _MM_SHUFFLE(2, 0, 2, 0));
                _r1 = _mm512_shuffle_i32x4(_tmp1, _tmp5, _MM_SHUFFLE(2, 0, 2, 0));
                _r2 = _mm512_shuffle_i32x4(_tmp2, _tmp6, _MM_SHUFFLE(2, 0, 2, 0));
                _r3 = _mm512_shuffle_i32x4(_tmp3, _tmp7, _MM_SHUFFLE(2, 0, 2, 0));
                _r4 = _mm512_shuffle_i32x4(_tmp0, _tmp4, _MM_SHUFFLE(3, 1, 3, 1));
                _r5 = _mm512_shuffle_i32x4(_tmp1, _tmp5, _MM_SHUFFLE(3, 1, 3, 1));
                _r6 = _mm512_shuffle_i32x4(_tmp2, _tmp6, _MM_SHUFFLE(3, 1, 3, 1));
                _r7 = _mm512_shuffle_i32x4(_tmp3, _tmp7, _MM_SHUFFLE(3, 1, 3, 1));
                _mm512_storeu_si512((__m512i*)pp, _r0);
                _mm512_storeu_si512((__m512i*)(pp + 32), _r1);
                _mm512_storeu_si512((__m512i*)(pp + 64), _r2);
                _mm512_storeu_si512((__m512i*)(pp + 96), _r3);
                _mm512_storeu_si512((__m512i*)(pp + 128), _r4);
                _mm512_storeu_si512((__m512i*)(pp + 160), _r5);
                _mm512_storeu_si512((__m512i*)(pp + 192), _r6);
                _mm512_storeu_si512((__m512i*)(pp + 224), _r7);
                p0 += max_jj * batch * 16;
                pp += 256;
            }
            p0 -= (b * max_jj + jj) * 16;
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m512i _r0 = _mm512_loadu_si512((const __m512i*)p0);
                __m512i _r1 = _mm512_loadu_si512((const __m512i*)(p0 + 32));
                __m512i _r2 = _mm512_loadu_si512((const __m512i*)(p0 + 64));
                __m512i _r3 = _mm512_loadu_si512((const __m512i*)(p0 + 96));
                __m512i _tmp0 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(2, 0, 2, 0));
                __m512i _tmp1 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(3, 1, 3, 1));
                __m512i _tmp2 = _mm512_shuffle_i32x4(_r2, _r3, _MM_SHUFFLE(2, 0, 2, 0));
                __m512i _tmp3 = _mm512_shuffle_i32x4(_r2, _r3, _MM_SHUFFLE(3, 1, 3, 1));
                _r0 = _mm512_unpacklo_epi32(_tmp0, _tmp1);
                _r1 = _mm512_unpackhi_epi32(_tmp0, _tmp1);
                _r2 = _mm512_unpacklo_epi32(_tmp2, _tmp3);
                _r3 = _mm512_unpackhi_epi32(_tmp2, _tmp3);
                _tmp0 = _mm512_permutex_epi64(_r0, _MM_SHUFFLE(3, 1, 2, 0));
                _tmp1 = _mm512_permutex_epi64(_r1, _MM_SHUFFLE(3, 1, 2, 0));
                _tmp2 = _mm512_permutex_epi64(_r2, _MM_SHUFFLE(3, 1, 2, 0));
                _tmp3 = _mm512_permutex_epi64(_r3, _MM_SHUFFLE(3, 1, 2, 0));
                _r0 = _mm512_shuffle_i32x4(_tmp0, _tmp2, _MM_SHUFFLE(2, 0, 2, 0));
                _r1 = _mm512_shuffle_i32x4(_tmp0, _tmp2, _MM_SHUFFLE(3, 1, 3, 1));
                _r2 = _mm512_shuffle_i32x4(_tmp1, _tmp3, _MM_SHUFFLE(2, 0, 2, 0));
                _r3 = _mm512_shuffle_i32x4(_tmp1, _tmp3, _MM_SHUFFLE(3, 1, 3, 1));
                _mm512_storeu_si512((__m512i*)pp, _r0);
                _mm512_storeu_si512((__m512i*)(pp + 32), _r1);
                _mm512_storeu_si512((__m512i*)(pp + 64), _r2);
                _mm512_storeu_si512((__m512i*)(pp + 96), _r3);
                p0 += max_jj * batch * 8;
                pp += 128;
            }
            p0 -= (b * max_jj + jj) * 8;
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                __m512i _r0 = _mm512_loadu_si512((const __m512i*)p0);
                _mm512_storeu_si512((__m512i*)pp, _r0);
                p0 += max_jj * batch * 2;
                pp += 32;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                __m256i _r0 = _mm256_loadu_si256((const __m256i*)p0);
                _mm256_store_si256((__m256i*)pp, _r0);
                p0 += max_jj * batch;
                pp += 16;
            }
        }
#endif // __AVX512F__
        for (; jj + 7 < max_jj; jj += 8)
        {
            const short* p0 = B;

            int kk = 0;
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512i _r0 = _mm512_loadu_si512((const __m512i*)p0);
                __m512i _r1 = _mm512_loadu_si512((const __m512i*)(p0 + 32));
                __m512i _r2 = _mm512_loadu_si512((const __m512i*)(p0 + 64));
                __m512i _r3 = _mm512_loadu_si512((const __m512i*)(p0 + 96));
                __m512i _tmp0 = _mm512_shuffle_i32x4(_r0, _r2, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp1 = _mm512_shuffle_i32x4(_r0, _r2, _MM_SHUFFLE(3, 2, 3, 2));
                __m512i _tmp2 = _mm512_shuffle_i32x4(_r1, _r3, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp3 = _mm512_shuffle_i32x4(_r1, _r3, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm512_unpacklo_epi32(_tmp0, _tmp1);
                _r1 = _mm512_unpackhi_epi32(_tmp0, _tmp1);
                _r2 = _mm512_unpacklo_epi32(_tmp2, _tmp3);
                _r3 = _mm512_unpackhi_epi32(_tmp2, _tmp3);
                _tmp0 = _mm512_unpacklo_epi64(_r0, _r2);
                _tmp1 = _mm512_unpackhi_epi64(_r0, _r2);
                _tmp2 = _mm512_unpacklo_epi64(_r1, _r3);
                _tmp3 = _mm512_unpackhi_epi64(_r1, _r3);
                _r0 = _mm512_shuffle_i32x4(_tmp0, _tmp1, _MM_SHUFFLE(2, 0, 2, 0));
                _r1 = _mm512_shuffle_i32x4(_tmp2, _tmp3, _MM_SHUFFLE(2, 0, 2, 0));
                _r2 = _mm512_shuffle_i32x4(_tmp0, _tmp1, _MM_SHUFFLE(3, 1, 3, 1));
                _r3 = _mm512_shuffle_i32x4(_tmp2, _tmp3, _MM_SHUFFLE(3, 1, 3, 1));
                _mm512_storeu_si512((__m512i*)pp, _r0);
                _mm512_storeu_si512((__m512i*)(pp + 32), _r1);
                _mm512_storeu_si512((__m512i*)(pp + 64), _r2);
                _mm512_storeu_si512((__m512i*)(pp + 96), _r3);
                p0 += max_jj * batch * 16;
                pp += 128;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
#if __AVX__
                __m256 _r0 = _mm256_loadu_ps((const float*)p0);
                __m256 _r1 = _mm256_loadu_ps((const float*)(p0 + 16));
                __m256 _r2 = _mm256_loadu_ps((const float*)(p0 + 32));
                __m256 _r3 = _mm256_loadu_ps((const float*)(p0 + 48));
                __m256 _tmp0 = _mm256_permute2f128_ps(_r0, _r2, _MM_SHUFFLE(0, 2, 0, 0));
                __m256 _tmp1 = _mm256_permute2f128_ps(_r0, _r2, _MM_SHUFFLE(0, 3, 0, 1));
                __m256 _tmp2 = _mm256_permute2f128_ps(_r1, _r3, _MM_SHUFFLE(0, 2, 0, 0));
                __m256 _tmp3 = _mm256_permute2f128_ps(_r1, _r3, _MM_SHUFFLE(0, 3, 0, 1));
                _r0 = _mm256_unpacklo_ps(_tmp0, _tmp1);
                _r1 = _mm256_unpackhi_ps(_tmp0, _tmp1);
                _r2 = _mm256_unpacklo_ps(_tmp2, _tmp3);
                _r3 = _mm256_unpackhi_ps(_tmp2, _tmp3);
                _tmp0 = _mm256_castpd_ps(_mm256_unpacklo_pd(_mm256_castps_pd(_r0), _mm256_castps_pd(_r2)));
                _tmp1 = _mm256_castpd_ps(_mm256_unpackhi_pd(_mm256_castps_pd(_r0), _mm256_castps_pd(_r2)));
                _tmp2 = _mm256_castpd_ps(_mm256_unpacklo_pd(_mm256_castps_pd(_r1), _mm256_castps_pd(_r3)));
                _tmp3 = _mm256_castpd_ps(_mm256_unpackhi_pd(_mm256_castps_pd(_r1), _mm256_castps_pd(_r3)));
                _mm256_storeu_ps((float*)pp, _tmp0);
                _mm256_storeu_ps((float*)(pp + 16), _tmp1);
                _mm256_storeu_ps((float*)(pp + 32), _tmp2);
                _mm256_storeu_ps((float*)(pp + 48), _tmp3);
#else
                __m128i _r0 = _mm_load_si128((const __m128i*)p0);
                __m128i _r1 = _mm_load_si128((const __m128i*)(p0 + 8));
                __m128i _r2 = _mm_load_si128((const __m128i*)(p0 + 8 * 2));
                __m128i _r3 = _mm_load_si128((const __m128i*)(p0 + 8 * 3));
                __m128i _r4 = _mm_load_si128((const __m128i*)(p0 + 8 * 4));
                __m128i _r5 = _mm_load_si128((const __m128i*)(p0 + 8 * 5));
                __m128i _r6 = _mm_load_si128((const __m128i*)(p0 + 8 * 6));
                __m128i _r7 = _mm_load_si128((const __m128i*)(p0 + 8 * 7));
                transpose4x8_epi32(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm_store_si128((__m128i*)pp, _r0);
                _mm_store_si128((__m128i*)(pp + 8), _r1);
                _mm_store_si128((__m128i*)(pp + 8 * 2), _r2);
                _mm_store_si128((__m128i*)(pp + 8 * 3), _r3);
                _mm_store_si128((__m128i*)(pp + 8 * 4), _r4);
                _mm_store_si128((__m128i*)(pp + 8 * 5), _r5);
                _mm_store_si128((__m128i*)(pp + 8 * 6), _r6);
                _mm_store_si128((__m128i*)(pp + 8 * 7), _r7);
#endif // __AVX__
                p0 += max_jj * batch * 8;
                pp += 64;
            }
            p0 -= (b * max_jj + jj) * 8;
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
#if __AVX__
                __m256 _r0 = _mm256_loadu_ps((const float*)p0);
                _mm256_storeu_ps((float*)pp, _r0);
#else
                __m128i _r0 = _mm_loadu_si128((const __m128i*)p0);
                __m128i _r1 = _mm_loadu_si128((const __m128i*)(p0 + 8));
                _mm_store_si128((__m128i*)pp, _r0);
                _mm_store_si128((__m128i*)(pp + 8), _r1);
#endif // __AVX__
                p0 += max_jj * batch * 2;
                pp += 16;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                __m128i _r0 = _mm_loadu_si128((const __m128i*)p0);
                _mm_store_si128((__m128i*)pp, _r0);
                p0 += max_jj * batch;
                pp += 8;
            }
        }
#endif // defined(__x86_64__) || defined(_M_X64)
        for (; jj + 3 < max_jj; jj += 4)
        {
            const short* p0 = B;

            int kk = 0;
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512i _r0 = _mm512_loadu_si512((const __m512i*)p0);
                __m512i _r1 = _mm512_loadu_si512((const __m512i*)(p0 + 32));
                __m512i _tmp0 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(1, 0, 1, 0));
                __m512i _tmp1 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm512_unpacklo_epi32(_tmp0, _tmp1);
                _r1 = _mm512_unpackhi_epi32(_tmp0, _tmp1);
                _r0 = _mm512_permutex_epi64(_r0, _MM_SHUFFLE(3, 1, 2, 0));
                _r1 = _mm512_permutex_epi64(_r1, _MM_SHUFFLE(3, 1, 2, 0));
                _tmp0 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(1, 0, 1, 0));
                _tmp1 = _mm512_shuffle_i32x4(_r0, _r1, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm512_unpacklo_epi64(_tmp0, _tmp1);
                _r1 = _mm512_unpackhi_epi64(_tmp0, _tmp1);
                _mm512_storeu_si512((__m512i*)pp, _r0);
                _mm512_storeu_si512((__m512i*)(pp + 32), _r1);
                p0 += max_jj * batch * 16;
                pp += 64;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m128i _r0 = _mm_load_si128((const __m128i*)p0);
                __m128i _r1 = _mm_load_si128((const __m128i*)(p0 + 8));
                __m128i _r2 = _mm_load_si128((const __m128i*)(p0 + 8 * 2));
                __m128i _r3 = _mm_load_si128((const __m128i*)(p0 + 8 * 3));
                transpose4x4_epi32(_r0, _r1, _r2, _r3);
                _mm_storeu_si128((__m128i*)pp, _r0);
                _mm_storeu_si128((__m128i*)(pp + 8), _r1);
                _mm_storeu_si128((__m128i*)(pp + 8 * 2), _r2);
                _mm_storeu_si128((__m128i*)(pp + 8 * 3), _r3);
                p0 += max_jj * batch * 8;
                pp += 32;
            }
            p0 -= (b * max_jj + jj) * 8;
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                __m128i _r0 = _mm_loadu_si128((const __m128i*)p0);
                _mm_storeu_si128((__m128i*)pp, _r0);
                p0 += max_jj * batch * 2;
                pp += 8;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp[2] = p0[2];
                pp[3] = p0[3];
                p0 += max_jj * batch;
                pp += 4;
            }
        }
#endif // __SSE2__
        for (; jj + 1 < max_jj; jj += 2)
        {
            const short* p0 = B;

            int kk = 0;
#if __SSE2__
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m256i _r0 = _mm256_load_si256((const __m256i*)p0);
                __m256i _r1 = _mm256_load_si256((const __m256i*)(p0 + 16));
                transpose8x2_epi32(_r0, _r1);
                _mm256_storeu_si256((__m256i*)pp, _r0);
                _mm256_storeu_si256((__m256i*)(pp + 16), _r1);
                p0 += max_jj * batch * 16;
                pp += 32;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m128i _r0 = _mm_load_si128((const __m128i*)p0);
                __m128i _r1 = _mm_load_si128((const __m128i*)(p0 + 8));
                __m128i _tmp0 = _mm_unpacklo_epi32(_r0, _r1);
                __m128i _tmp1 = _mm_unpackhi_epi32(_r0, _r1);
                _mm_storeu_si128((__m128i*)pp, _tmp0);
                _mm_storeu_si128((__m128i*)(pp + 8), _tmp1);
                p0 += max_jj * batch * 8;
                pp += 16;
            }
            p0 -= (b * max_jj + jj) * 8;
#endif // __SSE2__
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp[2] = p0[2];
                pp[3] = p0[3];
                p0 += max_jj * batch * 2;
                pp += 4;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                p0 += max_jj * batch;
                pp += 2;
            }
        }
        for (; jj < max_jj; jj++)
        {
            const short* p0 = B;

            int kk = 0;
#if __SSE2__
#if __AVX512F__
            p0 += (b * max_jj + jj) * 16;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m256i _r0 = _mm256_load_si256((const __m256i*)p0);
                _mm256_storeu_si256((__m256i*)pp, _r0);
                p0 += max_jj * batch * 16;
                pp += 16;
            }
            p0 -= (b * max_jj + jj) * 16;
#endif // __AVX512F__
            p0 += (b * max_jj + jj) * 8;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m128i _r0 = _mm_load_si128((const __m128i*)p0);
                _mm_storeu_si128((__m128i*)pp, _r0);
                p0 += max_jj * batch * 8;
                pp += 8;
            }
            p0 -= (b * max_jj + jj) * 8;
#endif // __SSE2__
            p0 += (b * max_jj + jj) * 2;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                p0 += max_jj * batch * 2;
                pp += 2;
            }
            p0 -= (b * max_jj + jj) * 2;
            p0 += (b * max_jj + jj);
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                p0 += max_jj * batch;
                pp += 1;
            }
        }
    }
}